

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rexo.h
# Opt level: O3

rx_status rx_test_case_run(rx_summary *summary,rx_test_case *test_case)

{
  char *pcVar1;
  char *pcVar2;
  size_t __size;
  rx_set_up_fn p_Var3;
  rx_tear_down_fn p_Var4;
  rx_status rVar5;
  int iVar6;
  rx_test_case *__ptr;
  rx_uint64 rVar7;
  rx_test_case *prVar8;
  uint64_t time_begin;
  uint64_t time_end;
  rx_context context;
  uint64_t local_108;
  ulong local_100;
  rx_context local_f8;
  
  if (summary == (rx_summary *)0x0) {
    __assert_fail("summary != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/christophercrouzet[P]uuki/deps/rexo/include/rexo.h"
                  ,0x1971,
                  "enum rx_status rx_test_case_run(struct rx_summary *, const struct rx_test_case *)"
                 );
  }
  if (test_case == (rx_test_case *)0x0) {
    __assert_fail("test_case != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/christophercrouzet[P]uuki/deps/rexo/include/rexo.h"
                  ,0x1972,
                  "enum rx_status rx_test_case_run(struct rx_summary *, const struct rx_test_case *)"
                 );
  }
  pcVar1 = test_case->suite_name;
  if (pcVar1 == (char *)0x0) {
    __assert_fail("test_case->suite_name != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/christophercrouzet[P]uuki/deps/rexo/include/rexo.h"
                  ,0x1973,
                  "enum rx_status rx_test_case_run(struct rx_summary *, const struct rx_test_case *)"
                 );
  }
  pcVar2 = test_case->name;
  if (pcVar2 != (char *)0x0) {
    if (test_case->run == (rx_run_fn)0x0) {
      __assert_fail("test_case->run != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/christophercrouzet[P]uuki/deps/rexo/include/rexo.h"
                    ,0x1975,
                    "enum rx_status rx_test_case_run(struct rx_summary *, const struct rx_test_case *)"
                   );
    }
    if ((test_case->config).skip == 0) {
      __size = (test_case->config).fixture.size;
      prVar8 = test_case;
      local_f8.summary = summary;
      if (__size == 0) {
        __ptr = (rx_test_case *)0x0;
      }
      else {
        __ptr = (rx_test_case *)malloc(__size);
        if (__ptr == (rx_test_case *)0x0) {
          summary->error = "failed to allocate the data";
          rx__log(RX_LOG_LEVEL_ERROR,(char *)prVar8,0x1986,
                  "failed to allocate the data(suite: \"%s\", case: \"%s\")\n",pcVar1,pcVar2);
          return RX_ERROR_ALLOCATION;
        }
      }
      p_Var3 = (test_case->config).fixture.config.set_up;
      if ((p_Var3 == (rx_set_up_fn)0x0) ||
         (prVar8 = __ptr, rVar5 = (*p_Var3)(&local_f8,__ptr), rVar5 == RX_SUCCESS)) {
        rVar5 = rx__get_real_time(&local_108);
        if (rVar5 != RX_SUCCESS) {
          local_108 = 0xffffffffffffffff;
        }
        iVar6 = _setjmp((__jmp_buf_tag *)&local_f8);
        if (iVar6 == 0) {
          prVar8 = __ptr;
          (*test_case->run)(&local_f8,__ptr);
        }
        if ((local_108 == 0xffffffffffffffff) ||
           (rVar5 = rx__get_real_time(&local_100), rVar5 != RX_SUCCESS)) {
          rVar7 = 0;
          rx__log(RX_LOG_LEVEL_ERROR,(char *)prVar8,0x19a6,
                  "failed to measure the time elapsed (suite: \"%s\", case: \"%s\")\n",
                  test_case->suite_name,test_case->name);
        }
        else {
          rVar7 = local_100 - local_108;
          if (local_100 < local_108) {
            __assert_fail("time_end >= time_begin",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/christophercrouzet[P]uuki/deps/rexo/include/rexo.h"
                          ,0x19a9,
                          "enum rx_status rx_test_case_run(struct rx_summary *, const struct rx_test_case *)"
                         );
          }
        }
        summary->elapsed = rVar7;
        p_Var4 = (test_case->config).fixture.config.tear_down;
        rVar5 = RX_SUCCESS;
        if (p_Var4 != (rx_tear_down_fn)0x0) {
          (*p_Var4)(&local_f8,__ptr);
        }
      }
      else {
        summary->error = "failed to set-up the fixture";
        rx__log(RX_LOG_LEVEL_ERROR,(char *)prVar8,0x1994,
                "failed to set-up the fixture (suite: \"%s\", case: \"%s\")\n",test_case->suite_name
                ,test_case->name);
      }
      free(__ptr);
      return rVar5;
    }
    summary->skipped = 1;
    return RX_SUCCESS;
  }
  __assert_fail("test_case->name != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/christophercrouzet[P]uuki/deps/rexo/include/rexo.h"
                ,0x1974,
                "enum rx_status rx_test_case_run(struct rx_summary *, const struct rx_test_case *)")
  ;
}

Assistant:

RX__MAYBE_UNUSED RX__STORAGE enum rx_status
rx_test_case_run(struct rx_summary *summary,
                 const struct rx_test_case *test_case)
{
    enum rx_status status;
    struct rx_context context;
    void *data;
    uint64_t time_begin;
    uint64_t time_end;

    RX_ASSERT(summary != NULL);
    RX_ASSERT(test_case != NULL);
    RX_ASSERT(test_case->suite_name != NULL);
    RX_ASSERT(test_case->name != NULL);
    RX_ASSERT(test_case->run != NULL);

    if (test_case->config.skip) {
        summary->skipped = 1;
        return RX_SUCCESS;
    }

    status = RX_SUCCESS;
    context.summary = summary;

    if (test_case->config.fixture.size > 0) {
        data = RX_MALLOC(test_case->config.fixture.size);
        if (data == NULL) {
            summary->error = "failed to allocate the data\0";
            RX__LOG_ERROR_2("failed to allocate the data"
                            "(suite: \"%s\", case: \"%s\")\n",
                            test_case->suite_name,
                            test_case->name);
            return RX_ERROR_ALLOCATION;
        }
    } else {
        data = NULL;
    }

    if (test_case->config.fixture.config.set_up != NULL) {
        status = test_case->config.fixture.config.set_up(&context, data);
        if (status != RX_SUCCESS) {
            summary->error = "failed to set-up the fixture\0";
            RX__LOG_ERROR_2("failed to set-up the fixture "
                            "(suite: \"%s\", case: \"%s\")\n",
                            test_case->suite_name,
                            test_case->name);
            goto data_cleanup;
        }
    }

    if (rx__get_real_time(&time_begin) != RX_SUCCESS) {
        time_begin = (uint64_t)-1;
    }

    if (setjmp(context.env) == 0) {
        test_case->run(&context, data);
    }

    if (time_begin == (uint64_t)-1
        || rx__get_real_time(&time_end) != RX_SUCCESS) {
        RX__LOG_ERROR_2("failed to measure the time elapsed "
                        "(suite: \"%s\", case: \"%s\")\n",
                        test_case->suite_name,
                        test_case->name);
        summary->elapsed = 0;
    } else {
        RX_ASSERT(time_end >= time_begin);
        summary->elapsed = (rx_uint64)(time_end - time_begin);
    }

    if (test_case->config.fixture.config.tear_down != NULL) {
        test_case->config.fixture.config.tear_down(&context, data);
    }

data_cleanup:
    RX_FREE(data);
    return status;
}